

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManchesterAnalyzer.cpp
# Opt level: O1

void __thiscall ManchesterAnalyzer::SynchronizeManchester(ManchesterAnalyzer *this)

{
  bool bVar1;
  U32 UVar2;
  iterator iVar3;
  pointer ppVar4;
  pointer puVar5;
  unsigned_long_long *puVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  pointer puVar10;
  U32 UVar11;
  ulong uVar12;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> locations_to_save;
  U64 edge_location;
  unsigned_long_long *local_48;
  iterator iStack_40;
  unsigned_long_long *local_38;
  unsigned_long_long local_28;
  
  if (this->mSynchronized == false) {
    do {
      Analyzer::CheckIfThreadShouldExit();
      local_28 = AnalyzerChannelData::GetSampleNumber();
      AnalyzerChannelData::AdvanceToNextEdge();
      lVar8 = AnalyzerChannelData::GetSampleNumber();
      uVar9 = lVar8 - local_28;
      UVar11 = this->mT;
      UVar2 = this->mTError;
      if (uVar9 < UVar2 + UVar11 && UVar11 - UVar2 < uVar9) {
        iVar3._M_current =
             (this->mUnsyncedLocations).
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->mUnsyncedLocations).
            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>::
          _M_realloc_insert<unsigned_long_long_const&>
                    ((vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)
                     &this->mUnsyncedLocations,iVar3,&local_28);
        }
        else {
          *iVar3._M_current = local_28;
          (this->mUnsyncedLocations).
          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
      }
      else {
        if (uVar9 < UVar2 + UVar11 * 2 && UVar11 * 2 - UVar2 < uVar9) {
          iVar3._M_current =
               (this->mUnsyncedLocations).
               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (this->mUnsyncedLocations).
              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>::
            _M_realloc_insert<unsigned_long_long_const&>
                      ((vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)
                       &this->mUnsyncedLocations,iVar3,&local_28);
          }
          else {
            *iVar3._M_current = local_28;
            (this->mUnsyncedLocations).
            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
          this->mSynchronized = true;
          iVar7 = AnalyzerChannelData::GetBitState();
          bVar1 = ((this->mSettings)._M_ptr)->mInverted;
          UVar11 = 1;
          if (((iVar7 == 0 & bVar1) == 0) && (UVar11 = 0, (iVar7 == 1 & bVar1) == 0)) {
            UVar11 = (U32)(bVar1 == false && iVar7 == 1);
          }
          local_48 = (unsigned_long_long *)0x0;
          iStack_40._M_current = (unsigned_long_long *)0x0;
          local_38 = (unsigned_long_long *)0x0;
          puVar10 = (this->mUnsyncedLocations).
                    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          if (puVar10 !=
              (this->mUnsyncedLocations).
              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
              super__Vector_impl_data._M_start) {
            do {
              if (iStack_40._M_current == local_38) {
                std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>::
                _M_realloc_insert<unsigned_long_long_const&>
                          ((vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)
                           &local_48,iStack_40,puVar10 + -1);
              }
              else {
                *iStack_40._M_current = puVar10[-1];
                iStack_40._M_current = iStack_40._M_current + 1;
              }
              puVar5 = (this->mUnsyncedLocations).
                       super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              puVar10 = puVar5 + -1;
              (this->mUnsyncedLocations).
              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
              super__Vector_impl_data._M_finish = puVar10;
              if (puVar10 !=
                  (this->mUnsyncedLocations).
                  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
                (this->mUnsyncedLocations).
                super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
                super__Vector_impl_data._M_finish = puVar5 + -2;
              }
              puVar10 = (this->mUnsyncedLocations).
                        super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            } while (puVar10 !=
                     (this->mUnsyncedLocations).
                     super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                     _M_impl.super__Vector_impl_data._M_start);
          }
          iVar3._M_current = iStack_40._M_current;
          puVar6 = local_48;
          if (local_48 != iStack_40._M_current) {
            uVar9 = (long)iStack_40._M_current - (long)local_48 >> 3;
            lVar8 = 0x3f;
            if (uVar9 != 0) {
              for (; uVar9 >> lVar8 == 0; lVar8 = lVar8 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long_long*,std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (local_48,iStack_40._M_current,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long_long*,std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (puVar6,iVar3._M_current);
          }
          uVar9 = (ulong)((long)iStack_40._M_current - (long)local_48) >> 3;
          if ((int)uVar9 != 0) {
            uVar12 = 0;
            do {
              SaveBit(this,local_48[uVar12],UVar11);
              uVar12 = uVar12 + 1;
            } while ((uVar9 & 0xffffffff) != uVar12);
          }
          if (local_48 == (unsigned_long_long *)0x0) {
            return;
          }
          operator_delete(local_48);
          return;
        }
        this->mSynchronized = false;
        ppVar4 = (this->mBitsForNextByte).
                 super__Vector_base<std::pair<unsigned_long_long,_unsigned_long_long>,_std::allocator<std::pair<unsigned_long_long,_unsigned_long_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((this->mBitsForNextByte).
            super__Vector_base<std::pair<unsigned_long_long,_unsigned_long_long>,_std::allocator<std::pair<unsigned_long_long,_unsigned_long_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != ppVar4) {
          (this->mBitsForNextByte).
          super__Vector_base<std::pair<unsigned_long_long,_unsigned_long_long>,_std::allocator<std::pair<unsigned_long_long,_unsigned_long_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppVar4;
        }
        puVar10 = (this->mUnsyncedLocations).
                  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((this->mUnsyncedLocations).
            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
            super__Vector_impl_data._M_finish != puVar10) {
          (this->mUnsyncedLocations).
          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar10;
        }
        this->mIgnoreBitCount = ((this->mSettings)._M_ptr)->mBitsToIgnore;
      }
    } while (this->mSynchronized == false);
  }
  return;
}

Assistant:

void ManchesterAnalyzer::SynchronizeManchester()
{
    // we should already be on an edge, the first one out of idle.
    while( mSynchronized == false )
    {
        CheckIfThreadShouldExit();
        U64 edge_location = mManchester->GetSampleNumber();
        mManchester->AdvanceToNextEdge();
        U64 next_edge_location = mManchester->GetSampleNumber();
        U64 edge_distance = next_edge_location - edge_location;
        if( ( edge_distance > ( mT - mTError ) ) && ( edge_distance < ( mT + mTError ) ) ) // short
        {
            mUnsyncedLocations.push_back( edge_location );
        }
        else if( ( edge_distance > ( ( 2 * mT ) - mTError ) ) && ( edge_distance < ( ( 2 * mT ) + mTError ) ) ) // long
        {
            mUnsyncedLocations.push_back( edge_location );
            mSynchronized = true;
            BitState current_bit_state = mManchester->GetBitState();
            bool inverted = mSettings->mInverted;
            U32 bit_value = 0;
            if( ( inverted == true ) && ( current_bit_state == BIT_LOW ) ) // we are on a neg edge with inverted true
                bit_value = 1;                                             // the old marker will be the opposite of the current value.
            else if( ( inverted == true ) && ( current_bit_state == BIT_HIGH ) )
                bit_value = 0;
            else if( ( inverted == false ) && ( current_bit_state == BIT_LOW ) ) // we are on a neg edge with inverted false
                bit_value = 0;
            else if( ( inverted == false ) && ( current_bit_state == BIT_HIGH ) )
                bit_value = 1;
            std::vector<U64> locations_to_save;
            while( mUnsyncedLocations.size() > 0 )
            {
                locations_to_save.push_back( mUnsyncedLocations.back() );
                mUnsyncedLocations.pop_back();
                if( mUnsyncedLocations.size() > 0 )
                    mUnsyncedLocations.pop_back();
            }
            std::sort( locations_to_save.begin(), locations_to_save.end() );
            U32 count = locations_to_save.size();
            for( U32 i = 0; i < count; ++i )
                SaveBit( locations_to_save[ i ], bit_value );
            break;
        }
        else
        {
            // back to idle.
            Invalidate();
        }
    }
}